

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ctrl_t *pcVar1;
  TypeInfo *pTVar2;
  bool bVar3;
  uintptr_t v;
  slot_type *psVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  byte bVar8;
  size_t sVar9;
  undefined8 uVar10;
  byte bVar11;
  ctrl_t cVar12;
  ulong uVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  sVar6 = common->capacity_;
  if (sVar6 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  bVar8 = 0x80;
  if (sVar6 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                *)common);
    if (1 < common->size_) {
      psVar4 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                         *)common);
      uVar7 = ((ulong)(psVar4->value).first ^ 0x1917468) * -0x234dd359734ecb13;
      bVar8 = (byte)(((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                       (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                       (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                       (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ (ulong)(psVar4->value).first) *
                     0x5cb22ca68cb134ed >> 0x38) & 0x7f;
      bVar11 = 1;
      goto LAB_00f438d9;
    }
  }
  bVar11 = 0;
LAB_00f438d9:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar6 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  local_3e = bVar11;
  CommonFields::set_capacity(common,new_capacity);
  bVar3 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar8,8,0x10);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::Descriptor *, const google::protobuf::DynamicMessageFactory::TypeInfo *>, Hash = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::Descriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::Descriptor *const, const google::protobuf::DynamicMessageFactory::TypeInfo *>>]"
                 );
  }
  if ((bVar11 | sVar6 != 1) == 1) {
    psVar4 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::Descriptor_*,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_const_google::protobuf::DynamicMessageFactory::TypeInfo_*>_>_>
                         *)common);
    if (!bVar3) {
      if (sVar6 == 1) {
        uVar7 = ((ulong)local_58.heap.control ^ 0x1917468) * -0x234dd359734ecb13;
        uVar13 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                   (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                   (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 | (uVar7 & 0xff00) << 0x28
                  | uVar7 << 0x38) ^ (ulong)local_58.heap.control) * -0x234dd359734ecb13;
        FVar14 = find_first_non_full<void>
                           (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                   (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8
                                   | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38);
        uVar5 = FVar14.offset;
        uVar7 = common->capacity_;
        if (uVar7 <= uVar5) {
LAB_00f43b06:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
        pcVar1 = (common->heap_or_soo_).heap.control;
        pcVar1[uVar5] = cVar12;
        pcVar1[(ulong)((uint)uVar7 & 0xf) + (uVar5 - 0xf & uVar7)] = cVar12;
        common->capacity_ = 0xffffffffffffff9c;
        psVar4[uVar5].value.first = (Descriptor *)local_58.heap.control;
        psVar4[uVar5].value.second = (TypeInfo *)local_58.heap.slot_array;
        CommonFields::set_capacity(common,uVar7);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar9 = 0;
          sVar6 = local_48;
          uVar10 = local_58.heap.slot_array;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar9]) {
              uVar7 = (*(ulong *)uVar10 ^ (ulong)&hash_internal::MixingHashState::kSeed) *
                      -0x234dd359734ecb13;
              uVar13 = ((uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 |
                         (uVar7 & 0xff0000000000) >> 0x18 | (uVar7 & 0xff00000000) >> 8 |
                         (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
                         (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38) ^ *(ulong *)uVar10) *
                       -0x234dd359734ecb13;
              FVar14 = find_first_non_full<void>
                                 (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                         (uVar13 & 0xff0000000000) >> 0x18 |
                                         (uVar13 & 0xff00000000) >> 8 | (uVar13 & 0xff000000) << 8 |
                                         (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
                                         uVar13 << 0x38);
              uVar5 = FVar14.offset;
              uVar7 = common->capacity_;
              if (uVar7 <= uVar5) goto LAB_00f43b06;
              cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
              pcVar1 = (common->heap_or_soo_).heap.control;
              pcVar1[uVar5] = cVar12;
              pcVar1[(ulong)((uint)uVar7 & 0xf) + (uVar5 - 0xf & uVar7)] = cVar12;
              common->capacity_ = 0xffffffffffffff9c;
              pTVar2 = *(TypeInfo **)(uVar10 + 8);
              psVar4[uVar5].value.first = *(Descriptor **)uVar10;
              psVar4[uVar5].value.second = pTVar2;
              CommonFields::set_capacity(common,uVar7);
              sVar6 = local_48;
            }
            sVar9 = sVar9 + 1;
            uVar10 = uVar10 + 0x10;
          } while (sVar9 != sVar6);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,0x10);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }